

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STX.cpp
# Opt level: O2

void __thiscall Storage::Disk::STX::STX(STX *this,string *file_name)

{
  FileHolder *this_00;
  uint uVar1;
  bool bVar2;
  uint8_t uVar3;
  byte bVar4;
  uint16_t uVar5;
  uint32_t uVar6;
  uint uVar7;
  long lVar8;
  undefined4 *puVar9;
  
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__STX_0058ea40;
  this_00 = &this->file_;
  FileHolder::FileHolder(this_00,file_name,ReadWrite);
  bVar2 = FileHolder::check_signature(this_00,"RSY",4);
  if (bVar2) {
    uVar5 = FileHolder::get16le(this_00);
    if (uVar5 == 3) {
      FileHolder::seek(this_00,4,1);
      FileHolder::seek(this_00,1,1);
      uVar3 = FileHolder::get8(this_00);
      this->is_new_format_ = uVar3 == '\x02';
      FileHolder::seek(this_00,4,1);
      memset(this->offset_by_track_,0,0x800);
      this->track_count_ = 0;
      this->head_count_ = 1;
      while( true ) {
        lVar8 = FileHolder::tell(this_00);
        uVar6 = FileHolder::get32le(this_00);
        bVar2 = FileHolder::eof(this_00);
        if (bVar2) break;
        FileHolder::seek(this_00,10,1);
        bVar4 = FileHolder::get8(this_00);
        this->offset_by_track_[bVar4] = lVar8;
        uVar1 = bVar4 & 0x7f;
        if ((int)(bVar4 & 0x7f) < this->track_count_) {
          uVar1 = this->track_count_;
        }
        uVar7 = bVar4 >> 6 & 0xfffffffe;
        if ((int)uVar7 < this->head_count_) {
          uVar7 = this->head_count_;
        }
        this->track_count_ = uVar1;
        this->head_count_ = uVar7;
        FileHolder::seek(this_00,(ulong)uVar6 + lVar8,0);
      }
      return;
    }
  }
  puVar9 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar9 = 0xfffffffe;
  __cxa_throw(puVar9,&Error::typeinfo,0);
}

Assistant:

STX::STX(const std::string &file_name) : file_(file_name) {
	// Require that this be a version 3 Pasti.
	if(!file_.check_signature("RSY", 4)) throw Error::InvalidFormat;
	if(file_.get16le() != 3) throw Error::InvalidFormat;

	// Skip: tool used, 2 reserved bytes.
	file_.seek(4, SEEK_CUR);

	// Skip the track count, test for a new-style encoding, skip a reserved area.
	file_.seek(1, SEEK_CUR);
	is_new_format_ = file_.get8() == 2;
	file_.seek(4, SEEK_CUR);

	// Set all tracks absent.
	memset(offset_by_track_, 0, sizeof(offset_by_track_));

	// Parse the tracks table to fill in offset_by_track_. The only available documentation
	// for STX is unofficial and makes no promise about track order. Hence the bucket sort,
	// effectively putting them into track order.
	//
	//	Track descriptor layout:
	//
	//	0	4	Record size.
	//	4	4	Number of bytes in fuzzy mask record.
	//	8	2	Number of sectors on track.
	//	10	2	Track flags.
	//	12	2	Total number of bytes on track.
	//	14	1	Track number (b7 = side, b0-b6 = track).
	//	15	1	Track type.
	track_count_ = 0;
	head_count_ = 1;
	while(true) {
		const long offset = file_.tell();
		const uint32_t size = file_.get32le();
		if(file_.eof()) break;

		// Skip fields other than track position, then fill in table position and advance.
		file_.seek(10, SEEK_CUR);

		const uint8_t track_position = file_.get8();
		offset_by_track_[track_position] = offset;

		// Update the maximum surface dimensions.
		track_count_ = std::max(track_count_, track_position & 0x7f);
		head_count_ = std::max(head_count_, ((track_position & 0x80) >> 6));

		// Seek next track start.
		file_.seek(offset + size, SEEK_SET);
	}
}